

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

bool __thiscall
testing::internal::anon_unknown_35::UnitTestFilter::MatchesName(UnitTestFilter *this,string *name)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  bool bVar2;
  size_type sVar3;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __it;
  long lVar4;
  long lVar5;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var6;
  string *local_38;
  
  sVar3 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::count(&(this->exact_match_patterns_)._M_h,name);
  if (sVar3 != 0) {
    return true;
  }
  __it._M_current =
       (this->glob_patterns_).
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (this->glob_patterns_).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar5 = (long)pbVar1 - (long)__it._M_current;
  local_38 = name;
  for (lVar4 = lVar5 >> 7; 0 < lVar4; lVar4 = lVar4 + -1) {
    bVar2 = __gnu_cxx::__ops::
            _Iter_pred<testing::internal::(anonymous_namespace)::UnitTestFilter::MatchesName(std::__cxx11::string_const&)const::{lambda(std::__cxx11::string_const&)#1}>
            ::operator()((_Iter_pred<testing::internal::(anonymous_namespace)::UnitTestFilter::MatchesName(std::__cxx11::string_const&)const::_lambda(std::__cxx11::string_const&)_1_>
                          *)&local_38,__it);
    _Var6._M_current = __it._M_current;
    if (bVar2) goto LAB_0010fd23;
    bVar2 = __gnu_cxx::__ops::
            _Iter_pred<testing::internal::(anonymous_namespace)::UnitTestFilter::MatchesName(std::__cxx11::string_const&)const::{lambda(std::__cxx11::string_const&)#1}>
            ::operator()((_Iter_pred<testing::internal::(anonymous_namespace)::UnitTestFilter::MatchesName(std::__cxx11::string_const&)const::_lambda(std::__cxx11::string_const&)_1_>
                          *)&local_38,__it._M_current + 1);
    _Var6._M_current = __it._M_current + 1;
    if (bVar2) goto LAB_0010fd23;
    bVar2 = __gnu_cxx::__ops::
            _Iter_pred<testing::internal::(anonymous_namespace)::UnitTestFilter::MatchesName(std::__cxx11::string_const&)const::{lambda(std::__cxx11::string_const&)#1}>
            ::operator()((_Iter_pred<testing::internal::(anonymous_namespace)::UnitTestFilter::MatchesName(std::__cxx11::string_const&)const::_lambda(std::__cxx11::string_const&)_1_>
                          *)&local_38,__it._M_current + 2);
    _Var6._M_current = __it._M_current + 2;
    if (bVar2) goto LAB_0010fd23;
    bVar2 = __gnu_cxx::__ops::
            _Iter_pred<testing::internal::(anonymous_namespace)::UnitTestFilter::MatchesName(std::__cxx11::string_const&)const::{lambda(std::__cxx11::string_const&)#1}>
            ::operator()((_Iter_pred<testing::internal::(anonymous_namespace)::UnitTestFilter::MatchesName(std::__cxx11::string_const&)const::_lambda(std::__cxx11::string_const&)_1_>
                          *)&local_38,__it._M_current + 3);
    _Var6._M_current = __it._M_current + 3;
    if (bVar2) goto LAB_0010fd23;
    __it._M_current = __it._M_current + 4;
    lVar5 = lVar5 + -0x80;
  }
  lVar5 = lVar5 >> 5;
  if (lVar5 != 1) {
    if (lVar5 != 2) {
      _Var6._M_current = pbVar1;
      if ((lVar5 != 3) ||
         (bVar2 = __gnu_cxx::__ops::
                  _Iter_pred<testing::internal::(anonymous_namespace)::UnitTestFilter::MatchesName(std::__cxx11::string_const&)const::{lambda(std::__cxx11::string_const&)#1}>
                  ::operator()((_Iter_pred<testing::internal::(anonymous_namespace)::UnitTestFilter::MatchesName(std::__cxx11::string_const&)const::_lambda(std::__cxx11::string_const&)_1_>
                                *)&local_38,__it), _Var6._M_current = __it._M_current, bVar2))
      goto LAB_0010fd23;
      __it._M_current = __it._M_current + 1;
    }
    bVar2 = __gnu_cxx::__ops::
            _Iter_pred<testing::internal::(anonymous_namespace)::UnitTestFilter::MatchesName(std::__cxx11::string_const&)const::{lambda(std::__cxx11::string_const&)#1}>
            ::operator()((_Iter_pred<testing::internal::(anonymous_namespace)::UnitTestFilter::MatchesName(std::__cxx11::string_const&)const::_lambda(std::__cxx11::string_const&)_1_>
                          *)&local_38,__it);
    _Var6._M_current = __it._M_current;
    if (bVar2) goto LAB_0010fd23;
    __it._M_current = __it._M_current + 1;
  }
  bVar2 = __gnu_cxx::__ops::
          _Iter_pred<testing::internal::(anonymous_namespace)::UnitTestFilter::MatchesName(std::__cxx11::string_const&)const::{lambda(std::__cxx11::string_const&)#1}>
          ::operator()((_Iter_pred<testing::internal::(anonymous_namespace)::UnitTestFilter::MatchesName(std::__cxx11::string_const&)const::_lambda(std::__cxx11::string_const&)_1_>
                        *)&local_38,__it);
  _Var6._M_current = __it._M_current;
  if (!bVar2) {
    _Var6._M_current = pbVar1;
  }
LAB_0010fd23:
  return _Var6._M_current != pbVar1;
}

Assistant:

bool MatchesName(const std::string& name) const {
    return exact_match_patterns_.count(name) > 0 ||
           std::any_of(glob_patterns_.begin(), glob_patterns_.end(),
                       [&name](const std::string& pattern) {
                         return PatternMatchesString(
                             name, pattern.c_str(),
                             pattern.c_str() + pattern.size());
                       });
  }